

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReaderManager.cpp
# Opt level: O2

void __thiscall BufferedReaderManager::~BufferedReaderManager(BufferedReaderManager *this)

{
  pointer ppBVar1;
  vector<BufferedReader_*,_std::allocator<BufferedReader_*>_> *__range1;
  BufferedReader **m_fileReader;
  pointer ppBVar2;
  
  ppBVar1 = (this->m_fileReaders).
            super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar2 = (this->m_fileReaders).
                 super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppBVar2 != ppBVar1; ppBVar2 = ppBVar2 + 1) {
    if (*ppBVar2 != (BufferedReader *)0x0) {
      (*((*ppBVar2)->super_AbstractReader)._vptr_AbstractReader[1])();
    }
  }
  std::_Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>::~_Vector_base
            ((_Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_> *)this);
  return;
}

Assistant:

BufferedReaderManager::~BufferedReaderManager()
{
    for (const auto& m_fileReader : m_fileReaders)
    {
        delete m_fileReader;  // need to define destruction order first. This object MUST be deleted after
                              // MCVodStreamer
    }
}